

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O2

void makeMappings(vector<int,_std::allocator<int>_> *mapping,string *mapstring)

{
  pointer piVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  string newmap;
  
  std::operator+(&newmap,mapstring,' ');
  uVar6 = 0;
  uVar4 = 0;
  if (0 < (int)newmap._M_string_length) {
    uVar4 = newmap._M_string_length & 0xffffffff;
  }
  while ((uVar5 = uVar4, uVar4 != uVar6 &&
         (uVar5 = uVar6, 9 < (int)newmap._M_dataplus._M_p[uVar6] - 0x30U))) {
    uVar6 = uVar6 + 1;
  }
  piVar1 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  bVar2 = false;
  bVar3 = true;
  uVar9 = 0;
  uVar10 = 0;
  for (; (long)uVar5 < (long)(int)newmap._M_string_length; uVar5 = uVar5 + 1) {
    uVar8 = (int)newmap._M_dataplus._M_p[uVar5] - 0x30;
    if (uVar8 < 10) {
      if (bVar3) {
        uVar9 = uVar8 + uVar9 * 10;
        bVar2 = false;
      }
      else {
        uVar10 = uVar8 + uVar10 * 10;
        bVar3 = false;
        bVar2 = false;
      }
    }
    else {
      bVar7 = !bVar3;
      if (bVar2) {
        bVar7 = bVar3;
      }
      bVar2 = true;
      if (bVar7) {
        if (0x7e < (int)uVar9) {
          uVar9 = 0x7f;
        }
        uVar4 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar4 = 0;
        }
        if (0x7e < (int)uVar10) {
          uVar10 = 0x7f;
        }
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        piVar1[uVar4] = uVar10;
        bVar3 = true;
        uVar9 = 0;
        uVar10 = 0;
      }
      else {
        bVar3 = false;
      }
    }
  }
  std::__cxx11::string::~string((string *)&newmap);
  return;
}

Assistant:

void makeMappings(vector<int>& mapping, const string& mapstring) {
   string newmap = mapstring + ' ';
   int ltx = 0;
   int d = 1;
   int digit1 = 0;
   int digit2 = 0;
   int ii;
   for (ii=0; ii<(int)newmap.size(); ii++) {
      if (isdigit(newmap[ii])) {
         break;
      }
   }
   for (int i=ii; i<(int)newmap.size(); i++) {
      if (isdigit(newmap[i])) {
        if (d) {
          digit1 = digit1 * 10 + (newmap[i] - '0');
        } else {
          digit2 = digit2 * 10 + (newmap[i] - '0');
        }
        ltx = 0;
      } else {
         if (!ltx) {
            d = !d;
         }
         ltx = 1;
         if (d) {
            digit1 = digit1 > 127 ? 127 : digit1;
            digit1 = digit1 <   0 ?   0 : digit1;
            digit2 = digit2 > 127 ? 127 : digit2;
            digit2 = digit2 <   0 ?   0 : digit2;
            mapping[digit1] = digit2;
            digit1 = 0;
            digit2 = 0;
         }
      }
   }
}